

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

uint32 __thiscall
Clasp::Solver::ccMinimize
          (Solver *this,LitVec *cc,LitVec *removed,uint32 antes,CCMinRecursive *ccMin)

{
  uint uVar1;
  uint32 uVar2;
  pointer pLVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  size_type sVar11;
  ulong uVar12;
  ulong uVar13;
  
  if (ccMin != (CCMinRecursive *)0x0) {
    uVar5 = incEpoch(this,(this->assign_).assign_.ebo_.size,2);
    ccMin->open = uVar5 - 2;
  }
  if ((cc->ebo_).size == 1) {
    uVar5 = 0;
    uVar9 = 1;
    sVar11 = 1;
  }
  else {
    uVar10 = 1;
    uVar5 = 0;
    uVar9 = 1;
    uVar7 = 0;
    uVar12 = 1;
    do {
      if ((antes == 3) ||
         (bVar4 = ccRemovable(this,(Literal)((cc->ebo_).buf[uVar10].rep_ & 0xfffffffe ^ 2),antes,
                              ccMin), !bVar4)) {
        pLVar3 = (cc->ebo_).buf;
        uVar1 = pLVar3[uVar10].rep_;
        uVar6 = *(uint *)((long)(this->assign_).assign_.ebo_.buf + (ulong)(uVar1 & 0xfffffffc)) >> 4
        ;
        uVar8 = uVar7;
        if (uVar7 < uVar6) {
          uVar8 = uVar6;
        }
        if (uVar7 < uVar6) {
          uVar5 = 0;
          uVar9 = (uint)uVar12;
        }
        uVar5 = (uVar5 + 1) - (uint)(uVar6 < uVar7);
        uVar13 = (ulong)((uint)uVar12 + 1);
        pLVar3[uVar12].rep_ = uVar1;
        uVar7 = uVar8;
      }
      else {
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (removed,(cc->ebo_).buf + uVar10);
        uVar13 = uVar12;
      }
      sVar11 = (size_type)uVar13;
      uVar10 = uVar10 + 1;
      uVar12 = uVar13;
    } while (uVar10 != (cc->ebo_).size);
  }
  pLVar3 = (cc->ebo_).buf;
  (cc->ebo_).size = sVar11;
  if (uVar9 != 1) {
    uVar2 = pLVar3[1].rep_;
    pLVar3[1].rep_ = pLVar3[uVar9].rep_;
    pLVar3[uVar9].rep_ = uVar2;
  }
  return uVar5;
}

Assistant:

uint32 Solver::ccMinimize(LitVec& cc, LitVec& removed, uint32 antes, CCMinRecursive* ccMin) {
	if (ccMin) { ccMinRecurseInit(*ccMin); }
	// skip the asserting literal
	LitVec::size_type j = 1;
	uint32 assertLevel  = 0;
	uint32 assertPos    = 1;
	uint32 onAssert     = 0;
	uint32 varLevel     = 0;
	for (LitVec::size_type i = 1; i != cc.size(); ++i) {
		if (antes == SolverStrategies::no_antes || !ccRemovable(~cc[i], antes, ccMin)) {
			if ( (varLevel = level(cc[i].var())) > assertLevel ) {
				assertLevel = varLevel;
				assertPos   = static_cast<uint32>(j);
				onAssert    = 0;
			}
			onAssert += (varLevel == assertLevel);
			cc[j++] = cc[i];
		}
		else {
			removed.push_back(cc[i]);
		}
	}
	cc.erase(cc.begin()+j, cc.end());
	if (assertPos != 1) {
		std::swap(cc[1], cc[assertPos]);
	}
	return onAssert;
}